

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void P_ClearPortals(void)

{
  FSectorPortal *pFVar1;
  
  FDisplacementTable::Create(&Displacements,1);
  TArray<FLinePortal,_FLinePortal>::Clear(&linePortals);
  TArray<FLinePortal_*,_FLinePortal_*>::Clear(&linkedPortals);
  TArray<FSectorPortal,_FSectorPortal>::Resize(&sectorPortals,2);
  pFVar1 = sectorPortals.Array;
  pFVar1->mType = 0;
  pFVar1->mFlags = 0;
  pFVar1->mPartner = 0;
  pFVar1->mPlane = 0;
  pFVar1->mPlaneZ = 0.0;
  (pFVar1->mSkybox).field_0.p = (AActor *)0x0;
  (pFVar1->mDisplacement).X = 0.0;
  (pFVar1->mDisplacement).Y = 0.0;
  pFVar1->mOrigin = (sector_t *)0x0;
  pFVar1->mDestination = (sector_t *)0x0;
  pFVar1->mFlags = 1;
  pFVar1[1].mType = 0;
  pFVar1[1].mFlags = 0;
  pFVar1[1].mPartner = 0;
  pFVar1[1].mPlane = 0;
  pFVar1[1].mOrigin = (sector_t *)0x0;
  pFVar1[1].mDestination = (sector_t *)0x0;
  pFVar1[1].mDisplacement.X = 0.0;
  pFVar1[1].mDisplacement.Y = 0.0;
  pFVar1[1].mPlaneZ = 0.0;
  pFVar1[1].mSkybox.field_0.p = (AActor *)0x0;
  pFVar1[1].mFlags = 1;
  return;
}

Assistant:

void P_ClearPortals()
{
	Displacements.Create(1);
	linePortals.Clear();
	linkedPortals.Clear();
	sectorPortals.Resize(2);
	// The first entry must always be the default skybox. This is what every sector gets by default.
	memset(&sectorPortals[0], 0, sizeof(sectorPortals[0]));
	sectorPortals[0].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[0].mFlags = PORTSF_SKYFLATONLY;
	// The second entry will be the default sky. This is for forcing a regular sky through the skybox picker
	memset(&sectorPortals[1], 0, sizeof(sectorPortals[0]));
	sectorPortals[1].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[1].mFlags = PORTSF_SKYFLATONLY;
}